

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  Snapshot snapshot;
  bool bVar1;
  PolicyStatus PVar2;
  char *lhss;
  char *rhss;
  ostream *poVar3;
  cmake *this_00;
  reference ppcVar4;
  cmMakefile *this_01;
  bool local_2b9;
  cmCommandContext local_278;
  Snapshot local_250;
  cmListFileBacktrace local_238;
  string local_1f8;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  ostringstream msg;
  string local_30 [32];
  cmGlobalNinjaGenerator *local_10;
  cmGlobalNinjaGenerator *this_local;
  
  local_10 = this;
  lhss = (char *)std::__cxx11::string::c_str();
  RequiredNinjaVersion_abi_cxx11_();
  rhss = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,rhss);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    poVar3 = std::operator<<((ostream *)local_1b8,"The detected version of Ninja (");
    std::operator<<(poVar3,(string *)&this->NinjaVersion);
    std::operator<<((ostream *)local_1b8,") is less than the version of Ninja required by CMake (");
    RequiredNinjaVersion_abi_cxx11_();
    poVar3 = std::operator<<((ostream *)local_1b8,local_1d8);
    std::operator<<(poVar3,").");
    std::__cxx11::string::~string(local_1d8);
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    std::__cxx11::ostringstream::str();
    cmState::Snapshot::Snapshot(&local_250,(cmState *)0x0);
    cmCommandContext::cmCommandContext(&local_278);
    snapshot.Position.Tree = local_250.Position.Tree;
    snapshot.State = local_250.State;
    snapshot.Position.Position = local_250.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_238,snapshot,&local_278);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1f8,&local_238,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_238);
    cmCommandContext::~cmCommandContext(&local_278);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  }
  else {
    OpenBuildFileStream(this);
    OpenRulesFileStream(this);
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          LocalGenerators,0);
    this_01 = cmLocalGenerator::GetMakefile(*ppcVar4);
    PVar2 = cmMakefile::GetPolicyStatus(this_01,CMP0058);
    this->PolicyCMP0058 = PVar2;
    local_2b9 = true;
    if (this->PolicyCMP0058 != OLD) {
      local_2b9 = this->PolicyCMP0058 == WARN;
    }
    this->ComputingUnknownDependencies = local_2b9;
    cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
    WriteAssumedSourceDependencies(this);
    WriteTargetAliases(this,(ostream *)this->BuildFileStream);
    WriteUnknownExplicitDependencies(this,(ostream *)this->BuildFileStream);
    WriteBuiltinTargets(this,(ostream *)this->BuildFileStream);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      std::ios::setstate((int)this->RulesFileStream +
                         (int)(this->RulesFileStream->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]);
      std::ios::setstate((int)this->BuildFileStream +
                         (int)(this->BuildFileStream->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]);
    }
    CloseCompileCommandsStream(this);
    CloseRulesFileStream(this);
    CloseBuildFileStream(this);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                    this->NinjaVersion.c_str(),
                                    RequiredNinjaVersion().c_str()))
    {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << this->RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, msg.str());
    return;
    }
  this->OpenBuildFileStream();
  this->OpenRulesFileStream();

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()
    ->GetPolicyStatus(cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->BuildFileStream);
  this->WriteUnknownExplicitDependencies(*this->BuildFileStream);
  this->WriteBuiltinTargets(*this->BuildFileStream);

  if (cmSystemTools::GetErrorOccuredFlag()) {
    this->RulesFileStream->setstate(std::ios_base::failbit);
    this->BuildFileStream->setstate(std::ios_base::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStream();
}